

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O0

void __thiscall arm::BrInst::~BrInst(BrInst *this)

{
  BrInst *in_RDI;
  
  ~BrInst(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~BrInst() {}